

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

void co_init_curr_thread_env(void)

{
  int iVar1;
  stCoRoutineEnv_t *env;
  stCoRoutine_t *psVar2;
  stCoEpoll_t *psVar3;
  long in_FS_OFFSET;
  
  env = (stCoRoutineEnv_t *)calloc(1,0x420);
  *(stCoRoutineEnv_t **)(in_FS_OFFSET + -0x10) = env;
  env->iCallStackSize = 0;
  psVar2 = co_create_env(env,(stCoRoutineAttr_t *)0x0,(pfn_co_routine_t)0x0,(void *)0x0);
  psVar2->cIsMain = '\x01';
  env->pending_co = (stCoRoutine_t *)0x0;
  env->occupy_co = (stCoRoutine_t *)0x0;
  coctx_init(&psVar2->ctx);
  iVar1 = env->iCallStackSize;
  env->iCallStackSize = iVar1 + 1;
  env->pCallStack[iVar1] = psVar2;
  psVar3 = AllocEpoll();
  env->pEpoll = psVar3;
  return;
}

Assistant:

void co_init_curr_thread_env()
{
	gCoEnvPerThread = (stCoRoutineEnv_t*)calloc( 1, sizeof(stCoRoutineEnv_t) );
	stCoRoutineEnv_t *env = gCoEnvPerThread;

	env->iCallStackSize = 0;
	struct stCoRoutine_t *self = co_create_env( env, NULL, NULL,NULL );
	self->cIsMain = 1;

	env->pending_co = NULL;
	env->occupy_co = NULL;

	coctx_init( &self->ctx );

	env->pCallStack[ env->iCallStackSize++ ] = self;

	stCoEpoll_t *ev = AllocEpoll();
	SetEpoll( env,ev );
}